

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation.cpp
# Opt level: O0

void __thiscall indigox::ElectronOpt::DetermineElectronsToAdd(ElectronOpt *this)

{
  bool bVar1;
  byte bVar2;
  int16_t iVar3;
  element_type *this_00;
  element_type *this_01;
  ElnVertProp *pEVar4;
  runtime_error *this_02;
  uint *in_RDI;
  ElnVertIterPair elnvs;
  MolVertexIter v;
  MolVertIterPair vs;
  Atom *in_stack_ffffffffffffff78;
  Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
  *in_stack_ffffffffffffff80;
  VertIterPair local_50 [3];
  _Self local_20;
  VertIterPair local_18;
  
  this_00 = std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x12eba5);
  iVar3 = MolecularGraph::GetTotalCharge(this_00);
  *in_RDI = -(int)iVar3;
  std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x12ebc4);
  local_18 = utils::
             Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
             GetVertices((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                          *)0x12ebcc);
  local_20._M_node = local_18.first._M_node;
  while (bVar1 = std::operator!=(&local_20,&local_18.second), bVar1) {
    std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12ec0a);
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_ffffffffffffff80);
    utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
    GetProperties((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                   *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x12ec2e);
    Atom::GetElement(in_stack_ffffffffffffff78);
    this_01 = std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x12ec4a);
    bVar2 = Element::GetValenceElectronCount(this_01);
    *in_RDI = (uint)bVar2 + *in_RDI;
    std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x12ec72);
    std::_List_iterator<void_*>::operator++(&local_20);
  }
  std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x12ecac);
  local_50[0] = utils::
                Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                ::GetVertices((Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                               *)0x12ecb4);
  while (bVar1 = std::operator!=(&local_50[0].first,&local_50[0].second), bVar1) {
    std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12ece5);
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_ffffffffffffff80);
    pEVar4 = utils::
             Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
             ::GetProperties(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    *in_RDI = *in_RDI - (uint)pEVar4->pre_placed;
    std::_List_iterator<void_*>::operator++(&local_50[0].first);
  }
  if (((Options::AssignElectrons::AUTO_USE_ELECTRON_PAIRS & 1U) == 0) || ((*in_RDI & 1) == 0)) {
    if ((Options::AssignElectrons::AUTO_USE_ELECTRON_PAIRS & 1U) != 0) {
      Options::AssignElectrons::USE_ELECTRON_PAIRS = true;
    }
  }
  else {
    Options::AssignElectrons::USE_ELECTRON_PAIRS = false;
  }
  if (((Options::AssignElectrons::USE_ELECTRON_PAIRS & 1U) != 0) && ((*in_RDI & 1) != 0)) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_02,"Unable to handle odd number of electrons when using electron pairs.");
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((Options::AssignElectrons::USE_ELECTRON_PAIRS & 1U) != 0) {
    *in_RDI = *in_RDI >> 1;
  }
  return;
}

Assistant:

void ElectronOpt::DetermineElectronsToAdd() {
  electronsToAdd_ = -molGraph_->GetTotalCharge();
  MolVertIterPair vs = molGraph_->GetVertices();
  for (MolVertexIter v = vs.first; v != vs.second; ++v)
    electronsToAdd_ += molGraph_->GetProperties(*v)->atom->GetElement()->GetValenceElectronCount();
  // All bonds should have order of at least 1
  // Preplace code
  ElnVertIterPair elnvs = elnGraph_->GetVertices();
  for (; elnvs.first != elnvs.second; ++elnvs.first)
    electronsToAdd_ -= elnGraph_->GetProperties(*elnvs.first)->pre_placed;
  //electronsToAdd_ -= 2 * molGraph_->NumEdges();
  // End Preplace code
  
  if (opt_::AUTO_USE_ELECTRON_PAIRS && electronsToAdd_ % 2)
    opt_::USE_ELECTRON_PAIRS = false;
  else if (opt_::AUTO_USE_ELECTRON_PAIRS)
    opt_::USE_ELECTRON_PAIRS = true;
  
  if (opt_::USE_ELECTRON_PAIRS && electronsToAdd_ % 2)
    throw std::runtime_error("Unable to handle odd number of electrons when using electron pairs.");
  else if (opt_::USE_ELECTRON_PAIRS)
    electronsToAdd_ /= 2;
}